

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

void gc_mark_expression(pExecutor exec,Expr expr)

{
  anon_union_8_8_707b72ea_for_Expr_1 func;
  ValueType VVar1;
  pExecutor exec_local;
  Expr expr_local;
  
  func = expr.field_1;
  VVar1 = expr.type;
  if (VVar1 == VT_ATOM) {
    gc_mark_atom(exec,func.val_atom);
  }
  else if (VVar1 == VT_PAIR) {
    gc_mark_pair(exec,func.val_atom);
  }
  else if (((undefined1  [16])expr & (undefined1  [16])0x80) == (undefined1  [16])0x0) {
    if (VVar1 == VT_FUNC_VAL) {
      gc_mark_function(exec,func.val_func);
    }
  }
  else {
    gc_mark_pointer(exec,func.val_ptr);
  }
  return;
}

Assistant:

void gc_mark_expression(pExecutor exec, Expr expr)
{
    if (expr.type == VT_ATOM)
        gc_mark_atom(exec, expr.val_atom);
    else if (expr.type == VT_PAIR)
        gc_mark_pair(exec, expr.val_pair);
    else if (expr.type & VT_POINTER)
        gc_mark_pointer(exec, expr.val_ptr);
    else if (expr.type == VT_FUNC_VAL)
        gc_mark_function(exec, expr.val_func);
}